

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsListCol4f
          (X3DImporter *this,int pAttrIdx,
          list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pValue)

{
  FIReader *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  pointer pfVar3;
  vector<float,_std::allocator<float>_> tlist;
  allocator local_69;
  _Vector_base<float,_std::allocator<float>_> local_68;
  string local_48;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  XML_ReadNode_GetAttrVal_AsArrF(this,pAttrIdx,(vector<float,_std::allocator<float>_> *)&local_68);
  if (((int)local_68._M_impl.super__Vector_impl_data._M_finish -
       (int)local_68._M_impl.super__Vector_impl_data._M_start & 0xcU) == 0) {
    for (pfVar3 = local_68._M_impl.super__Vector_impl_data._M_start;
        pfVar3 != local_68._M_impl.super__Vector_impl_data._M_finish; pfVar3 = pfVar3 + 4) {
      local_48._M_dataplus._M_p = *(pointer *)pfVar3;
      local_48._M_string_length = *(size_type *)(pfVar3 + 2);
      std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                (pValue,(value_type *)&local_48);
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_68);
    return;
  }
  pFVar1 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  iVar2 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                    (pFVar1,pAttrIdx);
  std::__cxx11::string::string((string *)&local_48,(char *)CONCAT44(extraout_var,iVar2),&local_69);
  Throw_ConvertFail_Str2ArrF(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_68);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsListCol4f(const int pAttrIdx, std::list<aiColor4D>& pValue)
{
    std::vector<float> tlist;

	XML_ReadNode_GetAttrVal_AsArrF(pAttrIdx, tlist);// read as list
	if(tlist.size() % 4) Throw_ConvertFail_Str2ArrF(mReader->getAttributeValue(pAttrIdx));

	// copy data to array
	for(std::vector<float>::iterator it = tlist.begin(); it != tlist.end();)
	{
		aiColor4D tcol;

		tcol.r = *it++;
		tcol.g = *it++;
		tcol.b = *it++;
		tcol.a = *it++;
		pValue.push_back(tcol);
	}
}